

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.h
# Opt level: O3

iter_type __thiscall
booster::locale::util::base_num_format<wchar_t>::do_real_put<double>
          (base_num_format<wchar_t> *this,iter_type out,ios_base *ios,char_type_conflict fill,
          double val)

{
  iter_type iVar1;
  ios_info *this_00;
  uint64_t uVar2;
  string_set *this_01;
  streambuf_type *psVar3;
  uint uVar4;
  ulong uVar5;
  bool bVar6;
  iter_type out_00;
  iter_type iVar7;
  undefined1 auVar8 [12];
  sstream_type ss;
  char c;
  locale local_1b0;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_1a8 [3];
  ios_base local_138 [264];
  
  iVar7._M_sbuf = out._M_sbuf;
  uVar4 = out._8_4_;
  this_00 = ios_info::get(ios);
  uVar2 = ios_info::display_flags(this_00);
  switch(uVar2) {
  case 0:
    std::__cxx11::wostringstream::wostringstream((wostringstream *)local_1a8);
    std::locale::classic();
    std::wios::imbue(&local_1b0);
    std::locale::~locale(&local_1b0);
    *(undefined4 *)((long)&local_1a8[0].field_2 + *(long *)(local_1a8[0]._M_dataplus._M_p + -6) + 8)
         = *(undefined4 *)(ios + 0x18);
    *(undefined8 *)
     ((long)&local_1a8[0]._M_string_length + *(long *)(local_1a8[0]._M_dataplus._M_p + -6)) =
         *(undefined8 *)(ios + 8);
    *(undefined8 *)((long)&local_1a8[0].field_2 + *(long *)(local_1a8[0]._M_dataplus._M_p + -6)) =
         *(undefined8 *)(ios + 0x10);
    auVar8 = std::num_put<wchar_t,std::ostreambuf_iterator<wchar_t,std::char_traits<wchar_t>>>::
             do_put(val,this,iVar7._M_sbuf,uVar4 & 0xff,
                    (undefined1 *)
                    ((long)&local_1a8[0]._M_dataplus._M_p +
                    *(long *)(local_1a8[0]._M_dataplus._M_p + -6)),fill);
    psVar3 = auVar8._0_8_;
    uVar5 = (ulong)auVar8._8_4_;
    *(undefined8 *)(ios + 0x10) = 0;
    std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    goto LAB_0019e23b;
  default:
    iVar7 = (iter_type)
            std::num_put<wchar_t,std::ostreambuf_iterator<wchar_t,std::char_traits<wchar_t>>>::
            do_put(val,this,iVar7._M_sbuf,uVar4 & 0xff,ios,fill);
    return iVar7;
  case 2:
    uVar2 = ios_info::currency_flags(this_00);
    if (uVar2 == 0) {
      bVar6 = false;
    }
    else {
      uVar2 = ios_info::currency_flags(this_00);
      bVar6 = uVar2 != 0x40;
    }
    iVar7 = (iter_type)
            (**(code **)(*(long *)this + 0x50))
                      (this,bVar6,iVar7._M_sbuf,uVar4 & 0xff,ios,fill,(longdouble)val);
    return iVar7;
  case 4:
    c = 'x';
    break;
  case 5:
    c = 'X';
    break;
  case 6:
    c = 'c';
    break;
  case 7:
    this_01 = ios_info::date_time_pattern_set(this_00);
    ios_info::string_set::get<wchar_t>(local_1a8,this_01);
    iVar7._8_4_ = uVar4 & 0xff;
    iVar7._12_4_ = 0;
    iVar7 = format_time(this,iVar7,ios,fill,(long)val,local_1a8);
    psVar3 = iVar7._M_sbuf;
    uVar5 = (ulong)iVar7._8_4_;
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p);
    }
LAB_0019e23b:
    iVar1._8_8_ = uVar5;
    iVar1._M_sbuf = psVar3;
    return iVar1;
  }
  out_00._8_4_ = uVar4 & 0xff;
  out_00._M_sbuf = iVar7._M_sbuf;
  out_00._12_4_ = 0;
  iVar7 = format_time(this,out_00,ios,fill,(long)val,c);
  return iVar7;
}

Assistant:

iter_type do_real_put (iter_type out, std::ios_base &ios, char_type fill, ValueType val) const
    {
        typedef std::num_put<char_type> super;

        ios_info &info=ios_info::get(ios);

        switch(info.display_flags()) {
        case flags::posix:
            {
                typedef std::basic_ostringstream<char_type> sstream_type;
                sstream_type ss;
                ss.imbue(std::locale::classic());
                ss.flags(ios.flags());
                ss.precision(ios.precision());
                ss.width(ios.width());
                iter_type ret_ptr = super::do_put(out,ss,fill,val);
                ios.width(0);
                return ret_ptr;
            }
        case flags::date:
            return format_time(out,ios,fill,static_cast<std::time_t>(val),'x');
        case flags::time:
            return format_time(out,ios,fill,static_cast<std::time_t>(val),'X');
        case flags::datetime:
            return format_time(out,ios,fill,static_cast<std::time_t>(val),'c');
        case flags::strftime:
            return format_time(out,ios,fill,static_cast<std::time_t>(val),info.date_time_pattern<char_type>());
        case flags::currency:
            {
                bool nat =  info.currency_flags()==flags::currency_default 
                            || info.currency_flags() == flags::currency_national;
                bool intl = !nat;
                return do_format_currency(intl,out,ios,fill,static_cast<long double>(val));
            }

        case flags::number:
        case flags::percent:
        case flags::spellout:
        case flags::ordinal:
        default:
            return super::do_put(out,ios,fill,val);
        }
    }